

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr1 * pcache1PinPage(PgHdr1 *pPage)

{
  uint *puVar1;
  PCache1 *pPVar2;
  PgHdr1 *pPVar3;
  PgHdr1 *pPVar4;
  
  pPVar2 = pPage->pCache;
  pPVar3 = pPage->pLruNext;
  pPVar4 = pPage->pLruPrev;
  pPVar4->pLruNext = pPVar3;
  pPVar3->pLruPrev = pPVar4;
  pPage->pLruNext = (PgHdr1 *)0x0;
  pPage->pLruPrev = (PgHdr1 *)0x0;
  pPage->isPinned = '\x01';
  puVar1 = &pPVar2->nRecyclable;
  *puVar1 = *puVar1 - 1;
  return pPage;
}

Assistant:

static PgHdr1 *pcache1PinPage(PgHdr1 *pPage){
  PCache1 *pCache;

  assert( pPage!=0 );
  assert( pPage->isPinned==0 );
  pCache = pPage->pCache;
  assert( pPage->pLruNext );
  assert( pPage->pLruPrev );
  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  pPage->pLruPrev->pLruNext = pPage->pLruNext;
  pPage->pLruNext->pLruPrev = pPage->pLruPrev;
  pPage->pLruNext = 0;
  pPage->pLruPrev = 0;
  pPage->isPinned = 1;
  assert( pPage->isAnchor==0 );
  assert( pCache->pGroup->lru.isAnchor==1 );
  pCache->nRecyclable--;
  return pPage;
}